

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

int __thiscall Board::get_result(Board *this,int player_number)

{
  int in_EAX;
  mapped_type *pmVar1;
  int iVar2;
  uint i;
  int iVar3;
  int local_28;
  int player_number_local;
  
  iVar2 = 0x7fffffff;
  local_28 = in_EAX;
  player_number_local = player_number;
  for (iVar3 = 1; iVar3 != 5; iVar3 = iVar3 + 1) {
    local_28 = iVar3;
    pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_player_scores,&local_28);
    if (*pmVar1 < iVar2) {
      iVar2 = *pmVar1;
    }
  }
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_player_scores,&player_number_local);
  return (int)(iVar2 == *pmVar1);
}

Assistant:

int Board::get_result(int player_number) // TODO implement draw - 2 people have same score
{
    int lowest_score = INT32_MAX;

    for (unsigned int i(1); i < 5; ++i) {
        int current_score = m_player_scores[i];
        if(current_score < lowest_score) {
            lowest_score = current_score;
        }
    }

    if(lowest_score == m_player_scores[player_number]) {
        return 1;
    }
    return 0;
}